

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

base_learner * stagewise_poly_setup(options_i *options,vw *all)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  options_i *options_00;
  stagewise_poly *poly;
  long lVar4;
  option_group_definition *poVar5;
  typed_option<float> *op;
  typed_option<unsigned_int> *op_00;
  base_learner *l;
  single_learner *base;
  learner<stagewise_poly,_example> *plVar6;
  bool stage_poly;
  size_type __dnew_5;
  size_type __dnew_4;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  bool local_419;
  _func_int ***local_418;
  _func_int **local_410;
  _func_int **local_408 [2];
  options_i *local_3f8;
  long local_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8 [2];
  _func_int ***local_3c8;
  _func_int **local_3c0;
  _func_int **local_3b8 [2];
  _func_int ***local_3a8;
  _func_int **local_3a0;
  _func_int **local_398 [2];
  string local_388;
  string local_368;
  string local_348;
  option_group_definition local_328;
  string local_2f0;
  _func_int ***local_2d0;
  _func_int **local_2c8;
  _func_int **local_2c0 [2];
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  typed_option<unsigned_int> local_170;
  typed_option<float> local_d0;
  
  poly = calloc_or_throw<stagewise_poly>(1);
  memset(poly,0,0x6968);
  lVar4 = 0x80;
  do {
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x50);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x60);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x70);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x80);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x20) = 0;
    lVar4 = lVar4 + 0x68;
  } while (lVar4 != 0x6880);
  (poly->synth_rec_f).x = 0.0;
  (poly->synth_rec_f).weight_index = 0;
  local_419 = false;
  local_2b0._0_8_ = (_func_int **)0x1c;
  local_418 = local_408;
  local_418 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)local_2b0);
  local_408[0] = (_func_int **)local_2b0._0_8_;
  builtin_strncpy((char *)((long)local_418 + 0xc),"lynomial",8);
  builtin_strncpy((char *)((long)local_418 + 0x14)," options",8);
  *(undefined4 *)local_418 = 0x67617453;
  builtin_strncpy((char *)((long)local_418 + 4),"ewis",4);
  *(undefined4 *)(local_418 + 1) = 0x6f702065;
  builtin_strncpy((char *)((long)local_418 + 0xc),"lyno",4);
  local_410 = (_func_int **)local_2b0._0_8_;
  *(char *)((long)local_418 + local_2b0._0_8_) = '\0';
  local_328.m_name._M_dataplus._M_p = (pointer)&local_328.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_328,local_418,(char *)(local_2b0._0_8_ + (long)local_418));
  local_328.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348.field_2._M_allocated_capacity = 0x6f705f6567617473;
  local_348.field_2._8_2_ = 0x796c;
  local_348._M_string_length = 10;
  local_348.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_348,&local_419);
  local_240 = true;
  local_3a8 = local_398;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x29;
  local_3a8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)&local_d0);
  local_398[0] = local_d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_3a8 + 0x19),"feature ",8);
  builtin_strncpy((char *)((long)local_3a8 + 0x21),"learning",8);
  local_3a8[2] = (_func_int **)0x6c61696d6f6e796c;
  local_3a8[3] = (_func_int **)0x6572757461656620;
  *local_3a8 = (_func_int **)0x6761747320657375;
  local_3a8[1] = (_func_int **)0x6f70206573697765;
  local_3a0 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_3a8 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_328,(typed_option<bool> *)local_2b0);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368.field_2._M_allocated_capacity._0_6_ = 0x5f6465686373;
  local_368.field_2._M_allocated_capacity._6_2_ = 0x7865;
  local_368.field_2._8_6_ = 0x746e656e6f70;
  local_368._M_string_length = 0xe;
  local_368.field_2._M_local_buf[0xe] = '\0';
  VW::config::typed_option<float>::typed_option(&local_d0,&local_368,&poly->sched_exponent);
  op = VW::config::typed_option<float>::default_value(&local_d0,1.0);
  local_3c8 = local_3b8;
  local_170.super_base_option._vptr_base_option = (_func_int **)0x32;
  local_3c8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3c8,(ulong)&local_170);
  local_3b8[0] = local_170.super_base_option._vptr_base_option;
  local_3c8[4] = (_func_int **)0x6564756c636e6920;
  local_3c8[5] = (_func_int **)0x7275746165662064;
  local_3c8[2] = (_func_int **)0x61757120676e696c;
  local_3c8[3] = (_func_int **)0x666f20797469746e;
  *local_3c8 = (_func_int **)0x746e656e6f707865;
  local_3c8[1] = (_func_int **)0x6c6f72746e6f6320;
  *(undefined2 *)(local_3c8 + 6) = 0x7365;
  local_3c0 = local_170.super_base_option._vptr_base_option;
  *(char *)((long)local_3c8 + (long)local_170.super_base_option._vptr_base_option) = '\0';
  local_3f8 = options;
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar5,op);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388.field_2._M_allocated_capacity = 0x7a735f6863746162;
  local_388._M_string_length = 8;
  local_388.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option(&local_170,&local_388,&poly->batch_sz);
  op_00 = VW::config::typed_option<unsigned_int>::default_value(&local_170,1000);
  local_210._0_8_ = (_func_int **)0x37;
  local_2d0 = local_2c0;
  local_2d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_2d0,(ulong)local_210);
  local_2c0[0] = (_func_int **)local_210._0_8_;
  local_2d0[4] = (_func_int **)0x6e6964756c636e69;
  local_2d0[5] = (_func_int **)0x662065726f6d2067;
  local_2d0[2] = (_func_int **)0x657a697320686374;
  local_2d0[3] = (_func_int **)0x2065726f66656220;
  *local_2d0 = (_func_int **)0x696c7069746c756d;
  local_2d0[1] = (_func_int **)0x6162206e6f207265;
  builtin_strncpy((char *)((long)local_2d0 + 0x2f),"features",8);
  local_2c8 = (_func_int **)local_210._0_8_;
  *(char *)((long)local_2d0 + local_210._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar5,op_00);
  local_3e8 = (long *)0x14;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f0,(ulong)&local_3e8);
  local_2f0.field_2._M_allocated_capacity = (size_type)local_3e8;
  builtin_strncpy(local_2f0._M_dataplus._M_p,"batch_sz_no_doubling",0x14);
  local_2f0._M_string_length = (size_type)local_3e8;
  local_2f0._M_dataplus._M_p[(long)local_3e8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_2f0,&poly->batch_sz_double);
  local_3f0 = 0x18;
  local_3e8 = local_3d8;
  local_3e8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_3e8,(ulong)&local_3f0);
  local_3d8[0] = local_3f0;
  *local_3e8 = 0x7a735f6863746162;
  local_3e8[1] = 0x6f6e2073656f6420;
  local_3e8[2] = 0x656c62756f642074;
  local_3e0 = local_3f0;
  *(char *)((long)local_3e8 + local_3f0) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar5,(typed_option<bool> *)local_210);
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8);
  }
  local_210._0_8_ = &PTR__typed_option_002d9fd8;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da048;
  if (local_170.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  options_00 = local_3f8;
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d9fa0;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d9fd8;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_328);
  if (local_419 == false) {
    plVar6 = (learner<stagewise_poly,_example> *)0x0;
  }
  else {
    poly->all = all;
    depthsbits_create(poly);
    poly->sd = (sort_data *)0x0;
    poly->sd_len = 0;
    poly->batch_sz_double = (bool)(poly->batch_sz_double ^ 1);
    poly->sum_sparsity = 0;
    poly->sum_input_sparsity = 0;
    poly->num_examples = 0;
    poly->sum_sparsity_sync = 0;
    poly->sum_input_sparsity_sync = 0;
    poly->num_examples_sync = 0;
    poly->last_example_counter = 0xffffffffffffffff;
    poly->numpasses = 1;
    poly->update_support = false;
    poly->original_ec = (example *)0x0;
    poly->next_batch_sz = poly->batch_sz;
    l = setup_base(options_00,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar6 = LEARNER::learner<stagewise_poly,example>::init_learner<LEARNER::learner<char,example>>
                       (poly,base,learn,predict,1,*(prediction_type_t *)(base + 0xd0));
    uVar2 = *(undefined8 *)(plVar6 + 0x18);
    uVar3 = *(undefined8 *)(plVar6 + 0x20);
    *(undefined8 *)(plVar6 + 0xb8) = uVar2;
    *(undefined8 *)(plVar6 + 0xc0) = uVar3;
    *(code **)(plVar6 + 200) = finish;
    *(code **)(plVar6 + 0x80) = save_load;
    *(undefined8 *)(plVar6 + 0x70) = uVar2;
    *(undefined8 *)(plVar6 + 0x78) = uVar3;
    *(undefined8 *)(plVar6 + 0x58) = uVar2;
    *(code **)(plVar6 + 0x68) = finish_example;
    *(undefined8 *)(plVar6 + 0x88) = uVar2;
    *(undefined8 *)(plVar6 + 0x90) = uVar3;
    *(code **)(plVar6 + 0x98) = end_pass;
    poly = (stagewise_poly *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_328.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
    operator_delete(local_328.m_name._M_dataplus._M_p);
  }
  if (poly != (stagewise_poly *)0x0) {
    free(poly);
  }
  return (base_learner *)plVar6;
}

Assistant:

base_learner *stagewise_poly_setup(options_i &options, vw &all)
{
  auto poly = scoped_calloc_or_throw<stagewise_poly>();
  bool stage_poly = false;
  option_group_definition new_options("Stagewise polynomial options");
  new_options.add(make_option("stage_poly", stage_poly).keep().help("use stagewise polynomial feature learning"))
      .add(make_option("sched_exponent", poly->sched_exponent)
               .default_value(1.f)
               .help("exponent controlling quantity of included features"))
      .add(make_option("batch_sz", poly->batch_sz)
               .default_value(1000)
               .help("multiplier on batch size before including more features"))
      .add(make_option("batch_sz_no_doubling", poly->batch_sz_double).help("batch_sz does not double"));
#ifdef MAGIC_ARGUMENT
  new_options.add(
      make_typed_option("magic_argument", poly->magic_argument).default_value(0.).help("magical feature flag"));
#endif  // MAGIC_ARGUMENT
  options.add_and_parse(new_options);

  if (!stage_poly)
    return nullptr;

  poly->all = &all;
  depthsbits_create(*poly.get());
  sort_data_create(*poly.get());

  poly->batch_sz_double = !poly->batch_sz_double;

  poly->sum_sparsity = 0;
  poly->sum_input_sparsity = 0;
  poly->num_examples = 0;
  poly->sum_sparsity_sync = 0;
  poly->sum_input_sparsity_sync = 0;
  poly->num_examples_sync = 0;
  poly->last_example_counter = -1;
  poly->numpasses = 1;
  poly->update_support = false;
  poly->original_ec = nullptr;
  poly->next_batch_sz = poly->batch_sz;

  learner<stagewise_poly, example> &l = init_learner(poly, as_singleline(setup_base(options, all)), learn, predict);
  l.set_finish(finish);
  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}